

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O1

void __thiscall CTcGenTarg::linker_ensure_mod_obj(CTcGenTarg *this,CTcSymMetaclass *mc)

{
  CTcSymObj *pCVar1;
  uint16_t tmp;
  CTcGenTarg *this_00;
  char buf [2];
  tct3_tadsobj_ctx obj_ctx;
  
  if ((mc->super_CTcSymMetaclassBase).mod_obj_ != (CTcSymObj *)0x0) {
    return;
  }
  this_00 = (CTcGenTarg *)0x0;
  pCVar1 = CTcSymObjBase::synthesize_modified_obj_sym(0);
  (pCVar1->super_CTcSymObjBase).metaclass_ = TC_META_ICMOD;
  (mc->super_CTcSymMetaclassBase).mod_obj_ = pCVar1;
  open_tadsobj(this_00,&obj_ctx,G_icmod_stream,(vm_obj_id_t)(pCVar1->super_CTcSymObjBase).obj_id_,0,
               0,0,0);
  buf = (char  [2])(((short)(int)(obj_ctx.stream)->ofs_ - (short)obj_ctx.obj_ofs) + -6);
  CTcDataStream::write_at(obj_ctx.stream,obj_ctx.obj_ofs + 4,buf,2);
  return;
}

Assistant:

void CTcGenTarg::linker_ensure_mod_obj(CTcSymMetaclass *mc)
{
    /* if there's no modifier object, create one */
    if (mc->get_mod_obj() == 0)
    {
        /* create a modifier object */
        CTcSymObj *mod_sym = CTcSymObj::synthesize_modified_obj_sym(FALSE);

        /* set it to be an IntrinsicClassModifier object */
        mod_sym->set_metaclass(TC_META_ICMOD);

        /* link the modifier to the metaclass */
        mc->set_mod_obj(mod_sym);
        
        /* 
         *   generate the object data - this is simply an empty object with
         *   no superclasses, and it goes in the intrinsic class modifier
         *   stream 
         */
        tct3_tadsobj_ctx obj_ctx;
        G_cg->open_tadsobj(
            &obj_ctx, G_icmod_stream,
            mod_sym->get_obj_id(), 0, 0, 0, 0);
        G_cg->close_tadsobj(&obj_ctx);
    }
}